

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

void sym_Export(char *symName)

{
  Symbol *local_18;
  Symbol *sym;
  char *symName_local;
  
  if (*symName == '!') {
    error("Anonymous labels cannot be exported\n");
  }
  else {
    local_18 = sym_FindScopedSymbol(symName);
    if (local_18 == (Symbol *)0x0) {
      local_18 = sym_Ref(symName);
    }
    local_18->isExported = true;
  }
  return;
}

Assistant:

void sym_Export(char const *symName)
{
	if (symName[0] == '!') {
		error("Anonymous labels cannot be exported\n");
		return;
	}

	struct Symbol *sym = sym_FindScopedSymbol(symName);

	// If the symbol doesn't exist, create a ref that can be purged
	if (!sym)
		sym = sym_Ref(symName);
	sym->isExported = true;
}